

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

ARMCPU * cpu_arm_init_arm(uc_struct_conflict1 *uc)

{
  CPUClass *k;
  CPUARMState *env;
  CPUClass *cc;
  CPUState *cs;
  ARMCPU *cpu;
  uc_struct_conflict1 *uc_local;
  
  uc_local = (uc_struct_conflict1 *)calloc(1,0xb720);
  if ((CPUState *)uc_local == (CPUState *)0x0) {
    uc_local = (uc_struct_conflict1 *)0x0;
  }
  else {
    if ((uc->mode & UC_MODE_MCLASS) == UC_MODE_ARM) {
      if ((uc->mode & UC_MODE_ARM926) == UC_MODE_ARM) {
        if ((uc->mode & UC_MODE_ARM946) == UC_MODE_ARM) {
          if ((uc->mode & UC_MODE_ARM1176) == UC_MODE_ARM) {
            if (uc->cpu_model == 0x7fffffff) {
              if ((uc->mode & UC_MODE_BIG_ENDIAN) == UC_MODE_ARM) {
                uc->cpu_model = 0x11;
              }
              else {
                uc->cpu_model = 5;
              }
            }
            else if (0x21 < (uint)uc->cpu_model) {
              free(uc_local);
              return (ARMCPU *)0x0;
            }
          }
          else {
            uc->cpu_model = 5;
          }
        }
        else {
          uc->cpu_model = 1;
        }
      }
      else {
        uc->cpu_model = 0;
      }
    }
    else {
      uc->cpu_model = 0xb;
    }
    k = (CPUClass *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x66e);
    ((CPUState *)uc_local)->cc = k;
    ((CPUState *)uc_local)->uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)uc_local;
    cpu_class_init((uc_struct *)uc,k);
    arm_cpu_class_init_arm(uc,k);
    cpu_common_initfn((uc_struct *)uc,(CPUState *)uc_local);
    arm_cpu_initfn_arm(uc,(CPUState *)uc_local);
    if (arm_cpus[uc->cpu_model].class_init != (_func_void_uc_struct_ptr_CPUClass_ptr_void_ptr *)0x0)
    {
      (*arm_cpus[uc->cpu_model].class_init)(uc,k,uc);
    }
    if (arm_cpus[uc->cpu_model].initfn != (_func_void_uc_struct_ptr_CPUState_ptr *)0x0) {
      (*arm_cpus[uc->cpu_model].initfn)(uc,(CPUState *)uc_local);
    }
    arm_cpu_instance_init((CPUState *)uc_local);
    arm_cpu_realizefn_arm(uc,(CPUState *)uc_local);
    cpu_address_space_init_arm((CPUState *)uc_local,0,((CPUState *)uc_local)->memory);
    qemu_init_vcpu_arm((CPUState *)uc_local);
    if (((uc->mode & UC_MODE_ARMBE8) != UC_MODE_ARM) ||
       ((uc->mode & UC_MODE_BIG_ENDIAN) != UC_MODE_ARM)) {
      *(uint *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x214c) =
           *(uint *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x214c) | 0x200;
    }
    if ((uc->mode & UC_MODE_BIG_ENDIAN) != UC_MODE_ARM) {
      ((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x454] =
           (TranslationBlock *)
           ((ulong)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x454] | 0x80);
    }
    ((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x477] =
         (TranslationBlock *)
         ((ulong)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x477] | 1);
    arm_rebuild_hflags_arm
              ((CPUARMState *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x3ff));
  }
  return (ARMCPU *)uc_local;
}

Assistant:

ARMCPU *cpu_arm_init(struct uc_struct *uc)
{
    ARMCPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    CPUARMState *env;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

#if !defined(TARGET_AARCH64)
    if (uc->mode & UC_MODE_MCLASS) {
        uc->cpu_model = UC_CPU_ARM_CORTEX_M33;
    } else if (uc->mode & UC_MODE_ARM926) {
        uc->cpu_model = UC_CPU_ARM_926;
    } else if (uc->mode & UC_MODE_ARM946) {
        uc->cpu_model = UC_CPU_ARM_946;
    } else if (uc->mode & UC_MODE_ARM1176) {
        uc->cpu_model = UC_CPU_ARM_1176;
    } else if (uc->cpu_model == INT_MAX) {
        if (uc->mode & UC_MODE_BIG_ENDIAN) {
            uc->cpu_model = UC_CPU_ARM_1176; // For BE32 mode.
        } else {
            uc->cpu_model = UC_CPU_ARM_CORTEX_A15; // cortex-a15
        }
    } else if (uc->cpu_model >= ARR_SIZE(arm_cpus)) {
        free(cpu);
        return NULL;
    }
#endif

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init ARMCPUClass */
    arm_cpu_class_init(uc, cc);

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init ARMCPU */
    arm_cpu_initfn(uc, cs);

#if !defined(TARGET_AARCH64)
    /* init ARM types */
    if (arm_cpus[uc->cpu_model].class_init) {
        arm_cpus[uc->cpu_model].class_init(uc, cc, uc);
    }
    if (arm_cpus[uc->cpu_model].initfn) {
        arm_cpus[uc->cpu_model].initfn(uc, cs);
    }
#endif

    /* postinit ARMCPU */
    arm_cpu_instance_init(cs);

    /* realize ARMCPU */
    arm_cpu_realizefn(uc, cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    // UC_MODE_BIG_ENDIAN means big endian code and big endian data (BE32), which 
    // is only supported before ARMv7-A (and it only makes sense in qemu usermode!).
    //
    // UC_MODE_ARMBE8 & BE32 difference shouldn't exist in fact. We do this for
    // backward compatibility.
    //
    // UC_MODE_ARMBE8 -> little endian code, big endian data
    // UC_MODE_ARMBE8 | UC_MODE_BIG_ENDIAN -> big endian code, big endian data
    //
    // In QEMU system, all arm instruction fetch **should be** little endian, however
    // we hack it to support (usermode) BE32.
    //
    // Reference:
    // https://developer.arm.com/documentation/ddi0406/c/Application-Level-Architecture/Application-Level-Memory-Model/Endian-support/Instruction-endianness?lang=en
    // https://developer.arm.com/documentation/den0024/a/ARMv8-Registers/Endianness
    env = &cpu->env;
    if (uc->mode & UC_MODE_ARMBE8 || uc->mode & UC_MODE_BIG_ENDIAN) {
        // Big endian data access.
        env->uncached_cpsr |= CPSR_E;
    }

    if (uc->mode & UC_MODE_BIG_ENDIAN) {
        // Big endian code access.
        env->cp15.sctlr_ns |= SCTLR_B;
    }

    // Backward compatiblity, start arm CPU in non-secure state.
    env->cp15.scr_el3 |= SCR_NS;

    arm_rebuild_hflags(env);

    return cpu;
}